

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

void __thiscall CoreML::ShapeRange::setValue(ShapeRange *this,size_t val)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  size_t local_18;
  size_t val_local;
  ShapeRange *this_local;
  
  local_18 = val;
  val_local = (size_t)this;
  bVar1 = isValid(this,val);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"Invalid setValue ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2," for range: ");
    poVar2 = ::operator<<(poVar2,this);
    std::operator<<(poVar2,"\n");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1d0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  RangeValue::set(&this->_minimum,local_18);
  RangeValue::set(&this->_maximum,local_18);
  return;
}

Assistant:

void ShapeRange::setValue(size_t val) {
    if (isValid(val)) {
        _minimum.set(val);
        _maximum.set(val);
    }
    else {
        std::stringstream ss;
        ss << "Invalid setValue " << val << " for range: " << *this << "\n";
        throw std::runtime_error(ss.str());
    }
}